

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::MergeAddSubArithmetic::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  TypeManager *this_00;
  Type *type_00;
  ConstantManager *this_01;
  Constant *input1;
  const_reference ppCVar4;
  reference ppCVar5;
  bool bVar6;
  Operand *local_1c0;
  allocator<spvtools::opt::Operand> local_195;
  uint32_t local_194;
  iterator local_190;
  undefined8 local_188;
  SmallVector<unsigned_int,_2UL> local_180;
  uint32_t local_154;
  iterator local_150;
  undefined8 local_148;
  SmallVector<unsigned_int,_2UL> local_140;
  Operand local_118;
  Operand OStack_e8;
  iterator local_b8;
  _func_int **local_b0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_a8;
  uint32_t local_8c;
  uint32_t local_88;
  uint32_t op2;
  uint32_t op1;
  Op op;
  bool first_is_variable;
  Constant *pCStack_78;
  Constant *const_input2;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  other_constants;
  Instruction *other_inst;
  Constant *const_input1;
  uint32_t width;
  bool uses_float;
  ConstantManager *const_mgr;
  Type *type;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  OVar2 = opt::Instruction::opcode(inst);
  bVar6 = true;
  if (OVar2 != OpFAdd) {
    OVar2 = opt::Instruction::opcode(inst);
    bVar6 = OVar2 == OpIAdd;
  }
  if (!bVar6) {
    __assert_fail("inst->opcode() == spv::Op::OpFAdd || inst->opcode() == spv::Op::OpIAdd",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x4c8,
                  "auto spvtools::opt::(anonymous namespace)::MergeAddSubArithmetic()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  this_00 = IRContext::get_type_mgr(context);
  uVar3 = opt::Instruction::type_id(inst);
  type_00 = analysis::TypeManager::GetType(this_00,uVar3);
  bVar6 = IsCooperativeMatrix(type_00);
  if (bVar6) {
    this_local._7_1_ = false;
  }
  else {
    this_01 = IRContext::get_constant_mgr(context);
    bVar6 = HasFloatingPoint(type_00);
    if ((bVar6) && (bVar1 = opt::Instruction::IsFloatingPointFoldingAllowed(inst), !bVar1)) {
      return false;
    }
    uVar3 = ElementWidth(type_00);
    if ((uVar3 == 0x20) || (uVar3 == 0x40)) {
      input1 = ConstInput(constants);
      if (input1 == (Constant *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        ppCVar4 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::operator[](constants,0);
        other_constants.
        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)NonConstInput(context,*ppCVar4,inst);
        if ((bVar6) &&
           (bVar6 = opt::Instruction::IsFloatingPointFoldingAllowed
                              ((Instruction *)
                               other_constants.
                               super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar6)) {
          return false;
        }
        OVar2 = opt::Instruction::opcode
                          ((Instruction *)
                           other_constants.
                           super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((OVar2 != OpFSub) &&
           (OVar2 = opt::Instruction::opcode
                              ((Instruction *)
                               other_constants.
                               super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage), OVar2 != OpISub)
           ) {
          return false;
        }
        analysis::ConstantManager::GetOperandConstants
                  ((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    *)&const_input2,this_01,
                   (Instruction *)
                   other_constants.
                   super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pCStack_78 = ConstInput((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                 *)&const_input2);
        if (pCStack_78 == (Constant *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          ppCVar5 = std::
                    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    ::operator[]((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                  *)&const_input2,0);
          op1._3_1_ = *ppCVar5 == (value_type)0x0;
          op2 = opt::Instruction::opcode(inst);
          local_88 = 0;
          local_8c = 0;
          if ((op1._3_1_ & 1) == 0) {
            OVar2 = opt::Instruction::opcode(inst);
            local_88 = PerformOperation(this_01,OVar2,input1,pCStack_78);
            local_8c = opt::Instruction::GetSingleWordInOperand
                                 ((Instruction *)
                                  other_constants.
                                  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
            op2 = opt::Instruction::opcode
                            ((Instruction *)
                             other_constants.
                             super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            local_88 = opt::Instruction::GetSingleWordInOperand
                                 ((Instruction *)
                                  other_constants.
                                  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
            OVar2 = opt::Instruction::opcode
                              ((Instruction *)
                               other_constants.
                               super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_8c = PerformOperation(this_01,OVar2,input1,pCStack_78);
          }
          if ((local_88 == 0) || (local_8c == 0)) {
            this_local._7_1_ = false;
          }
          else {
            opt::Instruction::SetOpcode(inst,op2);
            local_154 = local_88;
            local_150 = &local_154;
            local_148 = 1;
            init_list_00._M_len = 1;
            init_list_00._M_array = local_150;
            utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_140,init_list_00);
            Operand::Operand(&local_118,SPV_OPERAND_TYPE_ID,&local_140);
            local_194 = local_8c;
            local_190 = &local_194;
            local_188 = 1;
            init_list._M_len = 1;
            init_list._M_array = local_190;
            utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_180,init_list);
            Operand::Operand(&OStack_e8,SPV_OPERAND_TYPE_ID,&local_180);
            local_b8 = &local_118;
            local_b0 = (_func_int **)0x2;
            std::allocator<spvtools::opt::Operand>::allocator(&local_195);
            __l._M_len = (size_type)local_b0;
            __l._M_array = local_b8;
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                      (&local_a8,__l,&local_195);
            opt::Instruction::SetInOperands(inst,&local_a8);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                      (&local_a8);
            std::allocator<spvtools::opt::Operand>::~allocator(&local_195);
            local_1c0 = (Operand *)&local_b8;
            do {
              local_1c0 = local_1c0 + -1;
              Operand::~Operand(local_1c0);
            } while (local_1c0 != &local_118);
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_180);
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_140);
            this_local._7_1_ = true;
          }
        }
        op = OpUndef;
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                   *)&const_input2);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

FoldingRule MergeAddSubArithmetic() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>& constants) {
    assert(inst->opcode() == spv::Op::OpFAdd ||
           inst->opcode() == spv::Op::OpIAdd);
    const analysis::Type* type =
        context->get_type_mgr()->GetType(inst->type_id());

    if (IsCooperativeMatrix(type)) {
      return false;
    }

    analysis::ConstantManager* const_mgr = context->get_constant_mgr();
    bool uses_float = HasFloatingPoint(type);
    if (uses_float && !inst->IsFloatingPointFoldingAllowed()) return false;

    uint32_t width = ElementWidth(type);
    if (width != 32 && width != 64) return false;

    const analysis::Constant* const_input1 = ConstInput(constants);
    if (!const_input1) return false;
    Instruction* other_inst = NonConstInput(context, constants[0], inst);
    if (uses_float && !other_inst->IsFloatingPointFoldingAllowed())
      return false;

    if (other_inst->opcode() == spv::Op::OpFSub ||
        other_inst->opcode() == spv::Op::OpISub) {
      std::vector<const analysis::Constant*> other_constants =
          const_mgr->GetOperandConstants(other_inst);
      const analysis::Constant* const_input2 = ConstInput(other_constants);
      if (!const_input2) return false;

      bool first_is_variable = other_constants[0] == nullptr;
      spv::Op op = inst->opcode();
      uint32_t op1 = 0;
      uint32_t op2 = 0;
      if (first_is_variable) {
        // Subtract constants. Non-constant operand is first.
        op1 = other_inst->GetSingleWordInOperand(0u);
        op2 = PerformOperation(const_mgr, other_inst->opcode(), const_input1,
                               const_input2);
      } else {
        // Add constants. Constant operand is first. Change the opcode.
        op1 = PerformOperation(const_mgr, inst->opcode(), const_input1,
                               const_input2);
        op2 = other_inst->GetSingleWordInOperand(1u);
        op = other_inst->opcode();
      }
      if (op1 == 0 || op2 == 0) return false;

      inst->SetOpcode(op);
      inst->SetInOperands(
          {{SPV_OPERAND_TYPE_ID, {op1}}, {SPV_OPERAND_TYPE_ID, {op2}}});
      return true;
    }
    return false;
  };
}